

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job.c
# Opt level: O2

void set_bounce(parse_t *ps,char *timespec)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  char *fmt;
  UT_string *s;
  int local_1c;
  
  sVar3 = strlen(timespec);
  iVar2 = (int)sVar3 + -1;
  cVar1 = timespec[iVar2];
  timespec[iVar2] = '\0';
  iVar2 = __isoc99_sscanf(timespec,"%u",&local_1c);
  if (iVar2 == 1) {
    if (cVar1 == 'd') {
      local_1c = local_1c * 0x15180;
    }
    else if (cVar1 == 'h') {
      local_1c = local_1c * 0xe10;
    }
    else if (cVar1 == 'm') {
      local_1c = local_1c * 0x3c;
    }
    else if (cVar1 != 's') {
      s = ps->em;
      fmt = "invalid time unit in \'bounce every\'";
      goto LAB_0010447d;
    }
    ps->job->bounce_interval = local_1c;
  }
  else {
    s = ps->em;
    fmt = "invalid time interval in \'bounce every\'";
LAB_0010447d:
    utstring_printf(s,fmt);
    ps->rc = -1;
  }
  return;
}

Assistant:

void set_bounce(parse_t *ps, char *timespec) { 
  int l = strlen(timespec), interval;
  char *unit_ptr = &timespec[l-1];
  char unit = *unit_ptr;
  *unit_ptr = '\0';
  if (sscanf(timespec, "%u", &interval) != 1) {
    utstring_printf(ps->em, "invalid time interval in 'bounce every'");
    ps->rc = -1;
    return;
  }

  switch (unit) {
    case 's': break;
    case 'm': interval *= 60;       break;
    case 'h': interval *= 60*60;    break;
    case 'd': interval *= 60*60*24; break;
    default: 
      utstring_printf(ps->em, "invalid time unit in 'bounce every'");
      ps->rc = -1;
      return;
  }

  ps->job->bounce_interval = interval;
}